

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* serviceFlagsToStr_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,uint64_t flags)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  allocator<char> local_61;
  ulong local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
    lVar1 = 1L << ((byte)uVar2 & 0x3f);
    if ((flags >> (uVar2 & 0x3f) & 1) != 0) {
      local_60 = uVar2;
      if (lVar1 == 0x800) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"P2P_V2",&local_61);
      }
      else if (lVar1 == 4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"BLOOM",&local_61);
      }
      else if (lVar1 == 8) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"WITNESS",&local_61);
      }
      else if (lVar1 == 0x40) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"COMPACT_FILTERS",&local_61);
      }
      else if (lVar1 == 0x400) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"NETWORK_LIMITED",&local_61);
      }
      else if (lVar1 == 1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"NETWORK",&local_61);
      }
      else {
        tinyformat::format<unsigned_long>(&local_58,"UNKNOWN[2^%u]",&local_60);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::string> serviceFlagsToStr(uint64_t flags)
{
    std::vector<std::string> str_flags;

    for (size_t i = 0; i < sizeof(flags) * 8; ++i) {
        if (flags & (1ULL << i)) {
            str_flags.emplace_back(serviceFlagToStr(i));
        }
    }

    return str_flags;
}